

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * flatcc_builder_extend_vector(flatcc_builder_t *B,size_t count)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,(B->frame->container).vector.max_count);
  if (iVar1 != 0) {
    return (void *)0x0;
  }
  pvVar2 = push_ds(B,(flatbuffers_uoffset_t)count * (B->frame->container).table.vs_end);
  return pvVar2;
}

Assistant:

void *flatcc_builder_extend_vector(flatcc_builder_t *B, size_t count)
{
    if (vector_count_add(B, (uoffset_t)count, frame(container.vector.max_count))) {
        return 0;
    }
    return push_ds(B, frame(container.vector.elem_size) * (uoffset_t)count);
}